

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O2

void Ppmd7_Construct(CPpmd7 *p)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  p->Base = (Byte *)0x0;
  uVar4 = 0;
  for (uVar2 = 0; uVar2 != 0x26; uVar2 = uVar2 + 1) {
    iVar5 = ((uint)(uVar2 >> 2) & 0x3fffffff) + 1;
    if (0xb < uVar2) {
      iVar5 = 4;
    }
    iVar8 = 0;
    uVar6 = uVar4;
    do {
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
      p->Units2Indx[uVar7] = (Byte)uVar2;
      iVar8 = iVar8 + -1;
    } while (-iVar5 != iVar8);
    p->Indx2Units[uVar2] = (char)uVar4 - (char)iVar8;
    uVar4 = uVar6;
  }
  p->NS2BSIndx[0] = '\0';
  p->NS2BSIndx[1] = '\x02';
  p->NS2BSIndx[2] = '\x04';
  p->NS2BSIndx[3] = '\x04';
  p->NS2BSIndx[4] = '\x04';
  p->NS2BSIndx[5] = '\x04';
  p->NS2BSIndx[6] = '\x04';
  p->NS2BSIndx[7] = '\x04';
  p->NS2BSIndx[8] = '\x04';
  p->NS2BSIndx[9] = '\x04';
  p->NS2BSIndx[10] = '\x04';
  memset(p->NS2BSIndx + 0xb,6,0xf5);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    p->NS2Indx[lVar3] = (Byte)lVar3;
  }
  iVar5 = 3;
  iVar8 = 1;
  for (lVar3 = -0xfd; lVar3 != 0; lVar3 = lVar3 + 1) {
    p->NS2BSIndx[lVar3] = (Byte)iVar5;
    iVar1 = iVar8 + -1;
    iVar8 = iVar1;
    if (iVar1 == 0) {
      iVar8 = iVar5 + -1;
    }
    iVar5 = (uint)(iVar1 == 0) + iVar5;
  }
  p->HB2Flag[0x30] = '\0';
  p->HB2Flag[0x31] = '\0';
  p->HB2Flag[0x32] = '\0';
  p->HB2Flag[0x33] = '\0';
  p->HB2Flag[0x34] = '\0';
  p->HB2Flag[0x35] = '\0';
  p->HB2Flag[0x36] = '\0';
  p->HB2Flag[0x37] = '\0';
  p->HB2Flag[0x38] = '\0';
  p->HB2Flag[0x39] = '\0';
  p->HB2Flag[0x3a] = '\0';
  p->HB2Flag[0x3b] = '\0';
  p->HB2Flag[0x3c] = '\0';
  p->HB2Flag[0x3d] = '\0';
  p->HB2Flag[0x3e] = '\0';
  p->HB2Flag[0x3f] = '\0';
  p->HB2Flag[0x20] = '\0';
  p->HB2Flag[0x21] = '\0';
  p->HB2Flag[0x22] = '\0';
  p->HB2Flag[0x23] = '\0';
  p->HB2Flag[0x24] = '\0';
  p->HB2Flag[0x25] = '\0';
  p->HB2Flag[0x26] = '\0';
  p->HB2Flag[0x27] = '\0';
  p->HB2Flag[0x28] = '\0';
  p->HB2Flag[0x29] = '\0';
  p->HB2Flag[0x2a] = '\0';
  p->HB2Flag[0x2b] = '\0';
  p->HB2Flag[0x2c] = '\0';
  p->HB2Flag[0x2d] = '\0';
  p->HB2Flag[0x2e] = '\0';
  p->HB2Flag[0x2f] = '\0';
  p->HB2Flag[0x10] = '\0';
  p->HB2Flag[0x11] = '\0';
  p->HB2Flag[0x12] = '\0';
  p->HB2Flag[0x13] = '\0';
  p->HB2Flag[0x14] = '\0';
  p->HB2Flag[0x15] = '\0';
  p->HB2Flag[0x16] = '\0';
  p->HB2Flag[0x17] = '\0';
  p->HB2Flag[0x18] = '\0';
  p->HB2Flag[0x19] = '\0';
  p->HB2Flag[0x1a] = '\0';
  p->HB2Flag[0x1b] = '\0';
  p->HB2Flag[0x1c] = '\0';
  p->HB2Flag[0x1d] = '\0';
  p->HB2Flag[0x1e] = '\0';
  p->HB2Flag[0x1f] = '\0';
  p->HB2Flag[0] = '\0';
  p->HB2Flag[1] = '\0';
  p->HB2Flag[2] = '\0';
  p->HB2Flag[3] = '\0';
  p->HB2Flag[4] = '\0';
  p->HB2Flag[5] = '\0';
  p->HB2Flag[6] = '\0';
  p->HB2Flag[7] = '\0';
  p->HB2Flag[8] = '\0';
  p->HB2Flag[9] = '\0';
  p->HB2Flag[10] = '\0';
  p->HB2Flag[0xb] = '\0';
  p->HB2Flag[0xc] = '\0';
  p->HB2Flag[0xd] = '\0';
  p->HB2Flag[0xe] = '\0';
  p->HB2Flag[0xf] = '\0';
  memset(p->HB2Flag + 0x40,8,0xc0);
  return;
}

Assistant:

void Ppmd7_Construct(CPpmd7 *p)
{
  unsigned i, k, m;

  p->Base = 0;

  for (i = 0, k = 0; i < PPMD_NUM_INDEXES; i++)
  {
    unsigned step = (i >= 12 ? 4 : (i >> 2) + 1);
    do { p->Units2Indx[k++] = (Byte)i; } while (--step);
    p->Indx2Units[i] = (Byte)k;
  }

  p->NS2BSIndx[0] = (0 << 1);
  p->NS2BSIndx[1] = (1 << 1);
  memset(p->NS2BSIndx + 2, (2 << 1), 9);
  memset(p->NS2BSIndx + 11, (3 << 1), 256 - 11);

  for (i = 0; i < 3; i++)
    p->NS2Indx[i] = (Byte)i;
  for (m = i, k = 1; i < 256; i++)
  {
    p->NS2Indx[i] = (Byte)m;
    if (--k == 0)
      k = (++m) - 2;
  }

  memset(p->HB2Flag, 0, 0x40);
  memset(p->HB2Flag + 0x40, 8, 0x100 - 0x40);
}